

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

int Nwk_ManGraphListLength(Nwk_Grf_t *p,int List)

{
  Nwk_Vrt_t *local_38;
  Nwk_Vrt_t *local_30;
  int local_28;
  int Counter;
  int fVerbose;
  Nwk_Vrt_t *pThis;
  int List_local;
  Nwk_Grf_t *p_local;
  
  local_28 = 0;
  if (List == 0) {
    local_30 = (Nwk_Vrt_t *)0x0;
  }
  else {
    local_30 = p->pVerts[List];
  }
  _Counter = local_30;
  while (_Counter != (Nwk_Vrt_t *)0x0) {
    local_28 = local_28 + 1;
    if (_Counter->iNext == 0) {
      local_38 = (Nwk_Vrt_t *)0x0;
    }
    else {
      local_38 = p->pVerts[_Counter->iNext];
    }
    _Counter = local_38;
  }
  return local_28;
}

Assistant:

int Nwk_ManGraphListLength( Nwk_Grf_t * p, int List )
{
    Nwk_Vrt_t * pThis;
    int fVerbose = 0;
    int Counter = 0;
    Nwk_ListForEachVertex( p, List, pThis )
    {
        if ( fVerbose && Counter < 20 )
            printf( "%d ", p->pVerts[pThis->pEdges[0]]->nEdges );
        Counter++;
    }
    if ( fVerbose )
        printf( "\n" );
    return Counter;
}